

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall cs::instance_type::check_declar_var(instance_type *this,iterator it,bool regist)

{
  token_id *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  token_base **pptVar4;
  undefined8 uVar5;
  var_id *this_01;
  byte in_DL;
  iterator in_RDI;
  token_base *root;
  tree_type<cs::token_base_*> *t;
  iterator __end2;
  iterator __begin2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *parallel_list;
  _Self *in_stack_fffffffffffffee8;
  runtime_error *in_stack_fffffffffffffef0;
  allocator local_d9;
  string local_d8 [8];
  iterator *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff58;
  domain_manager *in_stack_ffffffffffffff60;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_80;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_60;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_58;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [31];
  undefined1 in_stack_ffffffffffffffe7;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff30);
  if (*pptVar4 == (token_base *)0x0) {
    local_4d = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Null pointer accessed.",&local_39);
    internal_error::internal_error
              ((internal_error *)in_stack_fffffffffffffef0,(string *)in_stack_fffffffffffffee8);
    local_4d = 0;
    __cxa_throw(uVar5,&internal_error::typeinfo,internal_error::~internal_error);
  }
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff30);
  iVar3 = (*(*pptVar4)->_vptr_token_base[2])();
  if (iVar3 == 0xf) {
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff30);
    local_60 = token_parallel::get_parallel((token_parallel *)*pptVar4);
    local_58 = local_60;
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)in_stack_fffffffffffffee8);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffffee8);
    while (bVar2 = std::operator!=((_Self *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8),
          bVar2) {
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator*(&local_80);
      tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffee8);
      check_declar_var((instance_type *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),in_RDI,
                       (bool)in_stack_ffffffffffffffe7);
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    *)in_stack_fffffffffffffef0);
    }
  }
  else {
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_ffffffffffffff30);
    this_00 = (token_id *)*pptVar4;
    if ((this_00 == (token_id *)0x0) ||
       (iVar3 = (*(this_00->super_token_base)._vptr_token_base[2])(), iVar3 != 4)) {
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"Wrong grammar for variable declaration.",&local_d9);
      runtime_error::runtime_error(in_stack_fffffffffffffef0,(string *)in_stack_fffffffffffffee8);
      __cxa_throw(uVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if ((bVar1 & 1) != 0) {
      this_01 = token_id::get_id(this_00);
      var_id::operator_cast_to_string_(this_01);
      domain_manager::add_record(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  return;
}

Assistant:

void instance_type::check_declar_var(tree_type<token_base *>::iterator it, bool regist)
	{
		if (it.data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				check_declar_var(t.root(), regist);
		}
		else {
			token_base *root = it.data();
			if (root == nullptr || root->get_type() != token_types::id)
				throw runtime_error("Wrong grammar for variable declaration.");
			if (regist)
				storage.add_record(static_cast<token_id *>(root)->get_id());
		}
	}